

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

JBLOCKARRAY
access_virt_barray(j_common_ptr cinfo,jvirt_barray_ptr ptr,JDIMENSION start_row,JDIMENSION num_rows,
                  boolean writable)

{
  int iVar1;
  uint uVar2;
  size_t bytestozero;
  uint in_ECX;
  uint in_EDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  size_t bytesperrow;
  long ltemp;
  JDIMENSION undef_row;
  JDIMENSION end_row;
  void *in_stack_ffffffffffffffd0;
  uint local_24;
  
  uVar2 = in_EDX + in_ECX;
  if (((*(uint *)(in_RSI + 1) < uVar2) || (*(uint *)(in_RSI + 2) < in_ECX)) || (*in_RSI == 0)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x16;
    (**(code **)*in_RDI)(in_RDI);
  }
  if ((in_EDX < *(uint *)((long)in_RSI + 0x1c)) ||
     ((uint)(*(int *)((long)in_RSI + 0x1c) + *(int *)((long)in_RSI + 0x14)) < uVar2)) {
    if (*(int *)((long)in_RSI + 0x2c) == 0) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x45;
      (**(code **)*in_RDI)(in_RDI);
    }
    if ((int)in_RSI[5] != 0) {
      do_barray_io((j_common_ptr)CONCAT44(start_row,num_rows),
                   (jvirt_barray_ptr)CONCAT44(writable,end_row),undef_row);
      *(undefined4 *)(in_RSI + 5) = 0;
    }
    if (*(uint *)((long)in_RSI + 0x1c) < in_EDX) {
      *(uint *)((long)in_RSI + 0x1c) = in_EDX;
    }
    else {
      in_stack_ffffffffffffffd0 = (void *)((ulong)uVar2 - (ulong)*(uint *)((long)in_RSI + 0x14));
      if ((long)in_stack_ffffffffffffffd0 < 0) {
        in_stack_ffffffffffffffd0 = (void *)0x0;
      }
      *(int *)((long)in_RSI + 0x1c) = (int)in_stack_ffffffffffffffd0;
    }
    do_barray_io((j_common_ptr)CONCAT44(start_row,num_rows),
                 (jvirt_barray_ptr)CONCAT44(writable,end_row),undef_row);
  }
  if (*(uint *)(in_RSI + 4) < uVar2) {
    if (*(uint *)(in_RSI + 4) < in_EDX) {
      local_24 = in_EDX;
      if (in_R8D != 0) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x16;
        (**(code **)*in_RDI)(in_RDI);
      }
    }
    else {
      local_24 = *(uint *)(in_RSI + 4);
    }
    if (in_R8D != 0) {
      *(uint *)(in_RSI + 4) = uVar2;
    }
    if (*(int *)((long)in_RSI + 0x24) == 0) {
      if (in_R8D == 0) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x16;
        (**(code **)*in_RDI)(in_RDI);
      }
    }
    else {
      bytestozero = (ulong)*(uint *)((long)in_RSI + 0xc) << 7;
      iVar1 = *(int *)((long)in_RSI + 0x1c);
      for (local_24 = local_24 - *(int *)((long)in_RSI + 0x1c); local_24 < uVar2 - iVar1;
          local_24 = local_24 + 1) {
        jzero_far(in_stack_ffffffffffffffd0,bytestozero);
      }
    }
  }
  if (in_R8D != 0) {
    *(undefined4 *)(in_RSI + 5) = 1;
  }
  return (JBLOCKARRAY)(*in_RSI + (ulong)(in_EDX - *(int *)((long)in_RSI + 0x1c)) * 8);
}

Assistant:

METHODDEF(JBLOCKARRAY)
access_virt_barray(j_common_ptr cinfo, jvirt_barray_ptr ptr,
                   JDIMENSION start_row, JDIMENSION num_rows, boolean writable)
/* Access the part of a virtual block array starting at start_row */
/* and extending for num_rows rows.  writable is true if  */
/* caller intends to modify the accessed area. */
{
  JDIMENSION end_row = start_row + num_rows;
  JDIMENSION undef_row;

  /* debugging check */
  if (end_row > ptr->rows_in_array || num_rows > ptr->maxaccess ||
      ptr->mem_buffer == NULL)
    ERREXIT(cinfo, JERR_BAD_VIRTUAL_ACCESS);

  /* Make the desired part of the virtual array accessible */
  if (start_row < ptr->cur_start_row ||
      end_row > ptr->cur_start_row + ptr->rows_in_mem) {
    if (!ptr->b_s_open)
      ERREXIT(cinfo, JERR_VIRTUAL_BUG);
    /* Flush old buffer contents if necessary */
    if (ptr->dirty) {
      do_barray_io(cinfo, ptr, TRUE);
      ptr->dirty = FALSE;
    }
    /* Decide what part of virtual array to access.
     * Algorithm: if target address > current window, assume forward scan,
     * load starting at target address.  If target address < current window,
     * assume backward scan, load so that target area is top of window.
     * Note that when switching from forward write to forward read, will have
     * start_row = 0, so the limiting case applies and we load from 0 anyway.
     */
    if (start_row > ptr->cur_start_row) {
      ptr->cur_start_row = start_row;
    } else {
      /* use long arithmetic here to avoid overflow & unsigned problems */
      long ltemp;

      ltemp = (long)end_row - (long)ptr->rows_in_mem;
      if (ltemp < 0)
        ltemp = 0;              /* don't fall off front end of file */
      ptr->cur_start_row = (JDIMENSION)ltemp;
    }
    /* Read in the selected part of the array.
     * During the initial write pass, we will do no actual read
     * because the selected part is all undefined.
     */
    do_barray_io(cinfo, ptr, FALSE);
  }
  /* Ensure the accessed part of the array is defined; prezero if needed.
   * To improve locality of access, we only prezero the part of the array
   * that the caller is about to access, not the entire in-memory array.
   */
  if (ptr->first_undef_row < end_row) {
    if (ptr->first_undef_row < start_row) {
      if (writable)             /* writer skipped over a section of array */
        ERREXIT(cinfo, JERR_BAD_VIRTUAL_ACCESS);
      undef_row = start_row;    /* but reader is allowed to read ahead */
    } else {
      undef_row = ptr->first_undef_row;
    }
    if (writable)
      ptr->first_undef_row = end_row;
    if (ptr->pre_zero) {
      size_t bytesperrow = (size_t)ptr->blocksperrow * sizeof(JBLOCK);
      undef_row -= ptr->cur_start_row; /* make indexes relative to buffer */
      end_row -= ptr->cur_start_row;
      while (undef_row < end_row) {
        jzero_far((void *)ptr->mem_buffer[undef_row], bytesperrow);
        undef_row++;
      }
    } else {
      if (!writable)            /* reader looking at undefined data */
        ERREXIT(cinfo, JERR_BAD_VIRTUAL_ACCESS);
    }
  }
  /* Flag the buffer dirty if caller will write in it */
  if (writable)
    ptr->dirty = TRUE;
  /* Return address of proper part of the buffer */
  return ptr->mem_buffer + (start_row - ptr->cur_start_row);
}